

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_1)

{
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00571e20;
  AssertionResult::AssertionResult(&this->assertionResult,&param_1->assertionResult);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,&param_1->infoMessages);
  Totals::Totals(&this->totals,&param_1->totals);
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;